

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O2

void __thiscall
skiplist_tests::findearliestatleast_test::test_method(findearliestatleast_test *this)

{
  uchar *puVar1;
  int iVar2;
  int64_t range;
  long lVar3;
  unsigned_long uVar4;
  CBlockIndex *pCVar5;
  CBlockIndex *pCVar6;
  uint uVar7;
  FastRandomContext *this_00;
  pointer pCVar8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  uint uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vBlocksMain;
  vector<uint256,_std::allocator<uint256>_> vHashMain;
  CChain chain;
  undefined1 local_58 [24];
  char **ppcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&vHashMain,100000,(allocator_type *)local_58);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            (&vBlocksMain,100000,(allocator_type *)local_58);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  uVar12 = 0;
  while( true ) {
    uVar11 = (uint)uVar12;
    if ((ulong)(((long)vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x98) <= uVar12) break;
    base_uint<256U>::base_uint((base_uint<256U> *)&chain,uVar12);
    ArithToUint256((uint256 *)local_58,(arith_uint256 *)&chain);
    puVar1 = vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12].super_base_blob<256U>.m_data._M_elems + 0x10;
    *(undefined8 *)puVar1 = local_58._16_8_;
    *(char ***)(puVar1 + 8) = ppcStack_40;
    *(undefined8 *)
     vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
     ._M_start[uVar12].super_base_blob<256U>.m_data._M_elems = local_58._0_8_;
    *(ulong *)(vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12].super_base_blob<256U>.m_data._M_elems + 8) =
         CONCAT71(local_58._9_7_,local_58[8]);
    pCVar8 = (pointer)0x0;
    if (uVar11 != 0) {
      pCVar8 = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar11 - 1);
    }
    vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12].nHeight = uVar11;
    vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12].pprev = pCVar8;
    vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12].phashBlock =
         vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start + uVar12;
    CBlockIndex::BuildSkip
              (vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + uVar12);
    if (uVar11 < 10) {
      vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12].nTime = uVar11;
      uVar7 = uVar11;
    }
    else {
      range = CBlockIndex::GetMedianTimePast
                        (vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar12);
      lVar3 = RandomMixin<FastRandomContext>::randrange<long>
                        (&this_00->super_RandomMixin<FastRandomContext>,range);
      uVar7 = (int)range + (int)lVar3;
      vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12].nTime = uVar7;
      if (uVar7 < vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11 - 1].nTimeMax) {
        uVar7 = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11 - 1].nTimeMax;
      }
    }
    vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12].nTimeMax = uVar7;
    uVar12 = (ulong)(uVar11 + 1);
  }
  pvVar9 = (iterator)0x7f;
  uVar11 = 0;
  for (uVar7 = 0; uVar12 = (ulong)uVar7,
      uVar12 < (ulong)(((long)vBlocksMain.
                              super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)vBlocksMain.
                             super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x98); uVar7 = uVar7 + 1) {
    if (uVar11 <= vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12].nTime) {
      uVar11 = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12].nTime;
    }
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x7f;
    file.m_begin = (iterator)&local_b8;
    msg.m_end = in_R9;
    msg.m_begin = (iterator)0x7f;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c8,msg);
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(chain.vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           uVar11 == vBlocksMain.
                                     super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar12].nTimeMax);
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_110._0_8_ = "curTimeMax == vBlocksMain[i].nTimeMax";
    local_110.m_message.px = (element_type *)0xc5085c;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011481f0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = (char **)&local_110;
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_d0 = "";
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&chain,(lazy_ostream *)local_58,1,0,WARN,
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(size_t)&local_d8,0x7f)
    ;
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CChain::SetTip(&chain,vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                        _M_impl.super__Vector_impl_data._M_finish + -1);
  iVar2 = 10000;
  while (bVar13 = iVar2 != 0, iVar2 = iVar2 + -1, bVar13) {
    uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&this_00->super_RandomMixin<FastRandomContext>,
                       ((long)vBlocksMain.
                              super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)vBlocksMain.
                             super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x98);
    uVar11 = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar4].nTime;
    pCVar5 = CChain::FindEarliestAtLeast(&chain,(ulong)uVar11,0);
    local_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x8c;
    file_00.m_begin = (iterator)&local_e8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f8,
               msg_00);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_120 = "ret->nTimeMax >= test_time";
    local_118 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011481f0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_120;
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_128 = "";
    pvVar9 = &DAT_00000001;
    pvVar10 = (iterator)0x0;
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(uVar11 <= pCVar5->nTimeMax);
    boost::test_tools::tt_detail::report_assertion
              (&local_110,(lazy_ostream *)local_58,1,0,WARN,
               CONCAT44(iVar2,in_stack_fffffffffffffe60),(size_t)&local_130,0x8c);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
    local_140 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x8d;
    file_01.m_begin = (iterator)&local_140;
    msg_01.m_end = pvVar10;
    msg_01.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
               msg_01);
    if (pCVar5->pprev == (CBlockIndex *)0x0) {
      local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(pCVar5->pprev->nTimeMax < uVar11);
    }
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_120 = "(ret->pprev==nullptr) || ret->pprev->nTimeMax < test_time";
    local_118 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011481f0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_120;
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_158 = "";
    pvVar9 = &DAT_00000001;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,(lazy_ostream *)local_58,1,0,WARN,
               CONCAT44(iVar2,in_stack_fffffffffffffe60),(size_t)&local_160,0x8d);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
    local_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x8e;
    file_02.m_begin = (iterator)&local_170;
    msg_02.m_end = pvVar10;
    msg_02.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
               msg_02);
    pCVar6 = CBlockIndex::GetAncestor
                       (vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                        _M_impl.super__Vector_impl_data._M_start + (int)uVar4,pCVar5->nHeight);
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(pCVar6 == pCVar5);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_120 = "vBlocksMain[r].GetAncestor(ret->nHeight) == ret";
    local_118 = "";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011481f0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppcStack_40 = &local_120;
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_188 = "";
    pvVar9 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,(lazy_ostream *)local_58,1,0,WARN,
               CONCAT44(iVar2,in_stack_fffffffffffffe60),(size_t)&local_190,0x8e);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  }
  std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base
            ((_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)&chain);
  std::_Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>::~_Vector_base
            (&vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findearliestatleast_test)
{
    std::vector<uint256> vHashMain(100000);
    std::vector<CBlockIndex> vBlocksMain(100000);
    for (unsigned int i=0; i<vBlocksMain.size(); i++) {
        vHashMain[i] = ArithToUint256(i); // Set the hash equal to the height
        vBlocksMain[i].nHeight = i;
        vBlocksMain[i].pprev = i ? &vBlocksMain[i - 1] : nullptr;
        vBlocksMain[i].phashBlock = &vHashMain[i];
        vBlocksMain[i].BuildSkip();
        if (i < 10) {
            vBlocksMain[i].nTime = i;
            vBlocksMain[i].nTimeMax = i;
        } else {
            // randomly choose something in the range [MTP, MTP*2]
            int64_t medianTimePast = vBlocksMain[i].GetMedianTimePast();
            int r{int(m_rng.randrange(medianTimePast))};
            vBlocksMain[i].nTime = uint32_t(r + medianTimePast);
            vBlocksMain[i].nTimeMax = std::max(vBlocksMain[i].nTime, vBlocksMain[i-1].nTimeMax);
        }
    }
    // Check that we set nTimeMax up correctly.
    unsigned int curTimeMax = 0;
    for (unsigned int i=0; i<vBlocksMain.size(); ++i) {
        curTimeMax = std::max(curTimeMax, vBlocksMain[i].nTime);
        BOOST_CHECK(curTimeMax == vBlocksMain[i].nTimeMax);
    }

    // Build a CChain for the main branch.
    CChain chain;
    chain.SetTip(vBlocksMain.back());

    // Verify that FindEarliestAtLeast is correct.
    for (unsigned int i=0; i<10000; ++i) {
        // Pick a random element in vBlocksMain.
        int r = m_rng.randrange(vBlocksMain.size());
        int64_t test_time = vBlocksMain[r].nTime;
        CBlockIndex* ret = chain.FindEarliestAtLeast(test_time, 0);
        BOOST_CHECK(ret->nTimeMax >= test_time);
        BOOST_CHECK((ret->pprev==nullptr) || ret->pprev->nTimeMax < test_time);
        BOOST_CHECK(vBlocksMain[r].GetAncestor(ret->nHeight) == ret);
    }
}